

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt __thiscall slang::SVInt::sext(SVInt *this,bitwidth_t bits)

{
  uint uVar1;
  uint64_t *output;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  uint newWords;
  undefined4 in_register_00000034;
  uint64_t *puVar3;
  uint64_t *input;
  uint oldWords;
  SVInt SVar4;
  
  puVar3 = (uint64_t *)CONCAT44(in_register_00000034,bits);
  uVar1 = (uint)puVar3[1];
  if (uVar1 <= in_EDX && in_EDX - uVar1 != 0) {
    if (in_EDX < 0x41 && (*(byte *)((long)puVar3 + 0xd) & 1) == 0) {
      SVInt(this,in_EDX,
            (ulong)((long)(*puVar3 << (-(char)uVar1 & 0x3fU)) >> ((byte)(in_EDX - uVar1) & 0x3f)) >>
            (-(char)in_EDX & 0x3fU),*(bool *)((long)puVar3 + 0xc));
      uVar2 = extraout_RDX_00;
    }
    else {
      allocUninitialized(this,in_EDX,*(bool *)((long)puVar3 + 0xc),
                         (bool)(in_EDX < 0x41 | *(byte *)((long)puVar3 + 0xd) & 1));
      uVar1 = (uint)puVar3[1];
      oldWords = uVar1 + 0x3f >> 6;
      newWords = in_EDX + 0x3f >> 6;
      input = puVar3;
      if ((*(byte *)((long)puVar3 + 0xd) & 1) != 0) {
        input = (uint64_t *)*puVar3;
      }
      output = (this->super_SVIntStorage).field_0.pVal;
      if (0x40 < uVar1) {
        input = (uint64_t *)*puVar3;
      }
      signExtendCopy(output,input,uVar1,oldWords,newWords);
      if (*(char *)((long)puVar3 + 0xd) == '\x01') {
        signExtendCopy(output + newWords,(uint64_t *)((ulong)(oldWords * 8) + *puVar3),
                       (bitwidth_t)puVar3[1],oldWords,newWords);
      }
      clearUnusedBits(this);
      uVar2 = extraout_RDX;
    }
    SVar4.super_SVIntStorage.bitWidth = (int)uVar2;
    SVar4.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar2 >> 0x20);
    SVar4.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar2 >> 0x28);
    SVar4.super_SVIntStorage._14_2_ = (short)((ulong)uVar2 >> 0x30);
    SVar4.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
    return (SVInt)SVar4.super_SVIntStorage;
  }
  assert::assertFailed
            ("bits > bitWidth",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
             ,0x602,"SVInt slang::SVInt::sext(bitwidth_t) const");
}

Assistant:

SVInt SVInt::sext(bitwidth_t bits) const {
    ASSERT(bits > bitWidth);

    if (bits <= SVInt::BITS_PER_WORD && !unknownFlag) {
        uint64_t newVal = val << (SVInt::BITS_PER_WORD - bitWidth); // NOLINT
        newVal = uint64_t((int64_t)newVal >> (bits - bitWidth));
        return SVInt(bits, newVal >> (SVInt::BITS_PER_WORD - bits), signFlag);
    }

    // copy and sign extend; for unknown values, this copies the data words
    // but not the unknown-indicator words, which we do separately below
    SVInt result = SVInt::allocUninitialized(bits, signFlag, unknownFlag);
    uint32_t oldWords = SVInt::getNumWords(bitWidth, false);
    uint32_t newWords = SVInt::getNumWords(bits, false);
    signExtendCopy(result.pVal, getRawData(), bitWidth, oldWords, newWords);

    if (unknownFlag)
        signExtendCopy(result.pVal + newWords, pVal + oldWords, bitWidth, oldWords, newWords);

    result.clearUnusedBits();
    return result;
}